

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O1

void * tommy_hashdyn_remove_existing(tommy_hashdyn *hashdyn,tommy_hashdyn_node *node)

{
  long lVar1;
  tommy_hashdyn_node **pptVar2;
  tommy_hashdyn_node *ptVar3;
  tommy_hashdyn_node *ptVar4;
  uint uVar5;
  tommy_node_struct *ptVar6;
  tommy_hashdyn_node *ptVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = hashdyn->bucket_mask & node->key;
  pptVar2 = hashdyn->bucket;
  ptVar3 = pptVar2[uVar5];
  ptVar4 = node->next;
  ptVar7 = ptVar4;
  if (ptVar4 == (tommy_hashdyn_node *)0x0) {
    ptVar7 = ptVar3;
  }
  ptVar7->prev = node->prev;
  if (ptVar3 == node) {
    ptVar6 = (tommy_node_struct *)(pptVar2 + uVar5);
  }
  else {
    ptVar6 = node->prev;
  }
  ptVar6->next = ptVar4;
  uVar5 = hashdyn->count - 1;
  hashdyn->count = uVar5;
  if ((uVar5 <= hashdyn->bucket_max >> 3) && (4 < hashdyn->bucket_bit)) {
    tommy_hashdyn_resize(hashdyn,hashdyn->bucket_bit - 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashdyn_remove_existing(tommy_hashdyn* hashdyn, tommy_hashdyn_node* node)
{
	tommy_count_t pos = node->key & hashdyn->bucket_mask;

	tommy_list_remove_existing(&hashdyn->bucket[pos], node);

	--hashdyn->count;

	hashdyn_shrink_step(hashdyn);

	return node->data;
}